

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FACT.c
# Opt level: O1

uint32_t FACTSoundBank_Stop(FACTSoundBank *pSoundBank,uint16_t nCueIndex,uint32_t dwFlags)

{
  FACTCue *pFVar1;
  FACTCue *pCue;
  
  if (pSoundBank == (FACTSoundBank *)0x0) {
    return 1;
  }
  FAudio_PlatformLockMutex(pSoundBank->parentEngine->apiLock);
  pCue = pSoundBank->cueList;
LAB_0010c1b4:
  do {
    if (pCue == (FACTCue *)0x0) {
      FAudio_PlatformUnlockMutex(pSoundBank->parentEngine->apiLock);
      return 0;
    }
    if (pCue->index == nCueIndex) {
      if ((dwFlags == 1) && (pCue->managed != '\0')) {
        pFVar1 = pCue->next;
        FACTCue_Destroy(pCue);
        pCue = pFVar1;
        goto LAB_0010c1b4;
      }
      FACTCue_Stop(pCue,dwFlags);
    }
    pCue = pCue->next;
  } while( true );
}

Assistant:

uint32_t FACTSoundBank_Stop(
	FACTSoundBank *pSoundBank,
	uint16_t nCueIndex,
	uint32_t dwFlags
) {
	FACTCue *backup, *cue;
	if (pSoundBank == NULL)
	{
		return 1;
	}

	FAudio_PlatformLockMutex(pSoundBank->parentEngine->apiLock);
	cue = pSoundBank->cueList;
	while (cue != NULL)
	{
		if (cue->index == nCueIndex)
		{
			if (	dwFlags == FACT_FLAG_STOP_IMMEDIATE &&
				cue->managed	)
			{
				/* Just blow this up now */
				backup = cue->next;
				FACTCue_Destroy(cue);
				cue = backup;
			}
			else
			{
				/* If managed, the mixer will destroy for us */
				FACTCue_Stop(cue, dwFlags);
				cue = cue->next;
			}
		}
		else
		{
			cue = cue->next;
		}
	}
	FAudio_PlatformUnlockMutex(pSoundBank->parentEngine->apiLock);
	return 0;
}